

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexay.cpp
# Opt level: O2

int __thiscall Lexay::getChar(Lexay *this)

{
  long lVar1;
  istream *piVar2;
  string local_50 [32];
  
  while( true ) {
    lVar1 = (long)linepos;
    if (linepos < linelen) {
      linepos = linepos + 1;
      return (int)currline_abi_cxx11_._M_dataplus._M_p[lVar1];
    }
    Basic::linenum = Basic::linenum + 1;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)Basic::source,(string *)&currline_abi_cxx11_,'\n');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    linelen = (int)currline_abi_cxx11_._M_string_length;
    linepos = 0;
    lVar1 = std::__cxx11::string::find((char *)&currline_abi_cxx11_,0x10759c);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_50,0x10b870);
      std::__cxx11::string::operator=((string *)&currline_abi_cxx11_,local_50);
      std::__cxx11::string::~string(local_50);
      linelen = (int)currline_abi_cxx11_._M_string_length;
    }
  }
  lineflag = true;
  return -1;
}

Assistant:

int Lexay::getChar(){
	while(linepos >= linelen){
		linenum++;
		if(std::getline((*source), currline, '\n')){
			linelen = currline.size();
			linepos = 0;
			size_t pos = currline.find("//");
			if(pos != std::string::npos){
				currline = currline.substr(0, pos);
				linelen = currline.size();
			}
		}else{
			lineflag = true;
			return EOF;
		}
	}

	return currline[linepos++];
}